

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash64.c
# Opt level: O3

uint ppc_hash64_hpte_page_shift_noslb(PowerPCCPU_conflict3 *cpu,uint64_t pte0,uint64_t pte1)

{
  PPCHash64Options *pPVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  
  uVar3 = 0xc;
  if ((pte0 & 4) != 0) {
    pPVar1 = cpu->hash64_opts;
    lVar4 = 8;
    uVar3 = 0;
    do {
      if (*(int *)((long)(pPVar1->sps[0].enc + -2) + lVar4) == 0) {
        return 0;
      }
      uVar2 = hpte_page_shift((PPCHash64SegmentPageSizes *)((long)(pPVar1->sps[0].enc + -2) + lVar4)
                              ,pte0,pte1);
      if (uVar2 != 0) {
        return uVar2;
      }
      lVar4 = lVar4 + 0x48;
    } while (lVar4 != 0x248);
  }
  return uVar3;
}

Assistant:

unsigned ppc_hash64_hpte_page_shift_noslb(PowerPCCPU *cpu,
                                          uint64_t pte0, uint64_t pte1)
{
    int i;

    if (!(pte0 & HPTE64_V_LARGE)) {
        return 12;
    }

    /*
     * The encodings in env->sps need to be carefully chosen so that
     * this gives an unambiguous result.
     */
    for (i = 0; i < PPC_PAGE_SIZES_MAX_SZ; i++) {
        const PPCHash64SegmentPageSizes *sps = &cpu->hash64_opts->sps[i];
        unsigned shift;

        if (!sps->page_shift) {
            break;
        }

        shift = hpte_page_shift(sps, pte0, pte1);
        if (shift) {
            return shift;
        }
    }

    return 0;
}